

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cpp
# Opt level: O1

void __thiscall
ComplexityVectorCoverageComplexityProperty::~ComplexityVectorCoverageComplexityProperty
          (ComplexityVectorCoverageComplexityProperty *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_PropertyTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0016a498;
  testinator::TestRegistry::Unregister
            ((this->super_PropertyTest).super_Test.m_registry,(Test *)this);
  pcVar2 = (this->super_PropertyTest).super_Test.m_name._M_dataplus._M_p;
  paVar1 = &(this->super_PropertyTest).super_Test.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

DEF_COMPLEXITY_PROPERTY(VectorCoverage, Complexity, ORDER_N2, const vector<int>&)
{
}